

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionInstruction
          (ValidationState_t *_,Instruction *inst,uint32_t version)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  NonSemanticClspvReflectionInstructions NVar4;
  uint uVar5;
  spv_result_t sVar6;
  Instruction *inst_00;
  long lVar7;
  char *pcVar8;
  string local_228;
  DiagnosticStream local_208;
  
  bVar3 = ValidationState_t::IsVoidType(_,(inst->inst_).type_id);
  if (bVar3) {
    NVar4 = Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(inst,3);
    uVar5 = NVar4 - NonSemanticClspvReflectionKernel;
    if (0x27 < uVar5) {
      return SPV_SUCCESS;
    }
    if (version < *(uint *)(&DAT_0035bc7c + (ulong)uVar5 * 4)) {
      inst_00 = inst;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
                (&local_228,(_anonymous_namespace_ *)_,
                 (ValidationState_t *)
                 (ulong)(inst->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[4],inst_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," requires version ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,", but parsed version is ",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002dbedc;
    }
    switch(uVar5) {
    case 0:
      sVar6 = ValidateClspvReflectionKernel(_,inst,version);
      return sVar6;
    case 1:
      sVar6 = ValidateClspvReflectionArgumentInfo(_,inst);
      return sVar6;
    default:
      psVar1 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      psVar2 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar6 = ValidateKernelDecl(_,inst);
      if (sVar6 != SPV_SUCCESS) {
        return sVar6;
      }
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,5);
      bVar3 = IsUint32Constant(_,uVar5);
      if (bVar3) {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,6);
        bVar3 = IsUint32Constant(_,uVar5);
        if (!bVar3) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar8 = "DescriptorSet must be a 32-bit unsigned integer OpConstant";
          lVar7 = 0x3a;
          break;
        }
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,7);
        bVar3 = IsUint32Constant(_,uVar5);
        if (bVar3) {
          if ((long)psVar1 - (long)psVar2 != 0x90) {
            return SPV_SUCCESS;
          }
          sVar6 = ValidateArgInfo(_,inst,8);
          if (sVar6 != SPV_SUCCESS) {
            return sVar6;
          }
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar8 = "Binding must be a 32-bit unsigned integer OpConstant";
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar8 = "Ordinal must be a 32-bit unsigned integer OpConstant";
      }
      lVar7 = 0x34;
      break;
    case 4:
    case 5:
    case 0x1a:
      sVar6 = ValidateClspvReflectionArgumentOffsetBuffer(_,inst);
      return sVar6;
    case 6:
    case 0x19:
      sVar6 = ValidateClspvReflectionArgumentPushConstant(_,inst);
      return sVar6;
    case 10:
      sVar6 = ValidateClspvReflectionArgumentWorkgroup(_,inst);
      return sVar6;
    case 0xb:
    case 0xc:
      sVar6 = ValidateClspvReflectionSpecConstantTriple(_,inst);
      return sVar6;
    case 0xd:
      sVar6 = ValidateClspvReflectionSpecConstantWorkDim(_,inst);
      return sVar6;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,4);
      bVar3 = IsUint32Constant(_,uVar5);
      if (bVar3) {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,5);
        bVar3 = IsUint32Constant(_,uVar5);
        if (bVar3) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar8 = "Size must be a 32-bit unsigned integer OpConstant";
        lVar7 = 0x31;
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar8 = "Offset must be a 32-bit unsigned integer OpConstant";
        lVar7 = 0x33;
      }
      break;
    case 0x14:
    case 0x15:
    case 0x1b:
      sVar6 = ValidateClspvReflectionInitializedData(_,inst);
      return sVar6;
    case 0x16:
      sVar6 = ValidateClspvReflectionSampler(_,inst);
      return sVar6;
    case 0x17:
      sVar6 = ValidateClspvReflectionPropertyRequiredWorkgroupSize(_,inst);
      return sVar6;
    case 0x18:
      sVar6 = ValidateClspvReflectionSubgroupMaxSize(_,inst);
      return sVar6;
    case 0x1c:
      sVar6 = ValidateClspvReflectionPointerRelocation(_,inst);
      return sVar6;
    case 0x1d:
    case 0x1e:
      sVar6 = ValidateClspvReflectionImageMetadataPushConstant(_,inst);
      return sVar6;
    case 0x1f:
    case 0x20:
      sVar6 = ValidateClspvReflectionImageMetadataUniform(_,inst);
      return sVar6;
    case 0x23:
    case 0x24:
      sVar6 = ValidateClspvReflectionPushConstantData(_,inst);
      return sVar6;
    case 0x25:
      sVar6 = ValidateClspvReflectionPrintfInfo(_,inst);
      return sVar6;
    case 0x26:
      sVar6 = ValidateClspvReflectionPrintfStorageBuffer(_,inst);
      return sVar6;
    case 0x27:
      sVar6 = ValidateClspvReflectionPrintfPushConstant(_,inst);
      return sVar6;
    }
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar8 = "Return Type must be OpTypeVoid";
    lVar7 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar8,lVar7);
LAB_002dbedc:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionInstruction(ValidationState_t& _,
                                                const Instruction* inst,
                                                uint32_t version) {
  if (!_.IsVoidType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Return Type must be OpTypeVoid";
  }

  uint32_t required_version = 0;
  const auto ext_inst =
      inst->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
    case NonSemanticClspvReflectionArgumentInfo:
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentWorkgroup:
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
    case NonSemanticClspvReflectionSpecConstantWorkDim:
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionLiteralSampler:
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      required_version = 1;
      break;
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      required_version = 2;
      break;
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
    case NonSemanticClspvReflectionArgumentPointerUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      required_version = 3;
      break;
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      required_version = 4;
      break;
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
    case NonSemanticClspvReflectionPrintfInfo:
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      required_version = 5;
      break;
    default:
      break;
  }
  if (version < required_version) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << ReflectionInstructionName(_, inst) << " requires version "
           << required_version << ", but parsed version is " << version;
  }

  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
      return ValidateClspvReflectionKernel(_, inst, version);
    case NonSemanticClspvReflectionArgumentInfo:
      return ValidateClspvReflectionArgumentInfo(_, inst);
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      return ValidateClspvReflectionArgumentBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPointerUniform:
      return ValidateClspvReflectionArgumentOffsetBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
      return ValidateClspvReflectionArgumentPushConstant(_, inst);
    case NonSemanticClspvReflectionArgumentWorkgroup:
      return ValidateClspvReflectionArgumentWorkgroup(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
      return ValidateClspvReflectionSpecConstantTriple(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkDim:
      return ValidateClspvReflectionSpecConstantWorkDim(_, inst);
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
      return ValidateClspvReflectionPushConstant(_, inst);
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
      return ValidateClspvReflectionInitializedData(_, inst);
    case NonSemanticClspvReflectionLiteralSampler:
      return ValidateClspvReflectionSampler(_, inst);
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      return ValidateClspvReflectionPropertyRequiredWorkgroupSize(_, inst);
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      return ValidateClspvReflectionSubgroupMaxSize(_, inst);
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
      return ValidateClspvReflectionPointerRelocation(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
      return ValidateClspvReflectionImageMetadataPushConstant(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      return ValidateClspvReflectionImageMetadataUniform(_, inst);
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
      return ValidateClspvReflectionPushConstantData(_, inst);
    case NonSemanticClspvReflectionPrintfInfo:
      return ValidateClspvReflectionPrintfInfo(_, inst);
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
      return ValidateClspvReflectionPrintfStorageBuffer(_, inst);
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      return ValidateClspvReflectionPrintfPushConstant(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}